

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ADC_ID_Y(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  ushort uVar4;
  bool bVar5;
  uint16_t sum;
  uint8_t op;
  uint8_t acp;
  CPU *this_local;
  
  this->cycles = 5;
  bVar1 = this->A;
  bVar2 = GetByte(this);
  uVar3 = ReadWord(this,(ushort)bVar2);
  bVar2 = ReadByte(this,uVar3 + this->Y);
  uVar4 = (ushort)this->A + (ushort)bVar2 + (ushort)((this->field_6).ps & 1);
  this->A = (uint8_t)uVar4;
  (this->field_6).ps =
       (this->field_6).ps & 0xfe | ((uVar4 & 0xff00) != 0 && -1 < (int)(uVar4 & 0xff00));
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  if ((bVar1 & 0x80) == (bVar2 & 0x80)) {
    bVar5 = (this->A & 0x80) != (bVar1 & 0x80);
  }
  else {
    bVar5 = false;
  }
  (this->field_6).ps = (this->field_6).ps & 0xbf | bVar5 << 6;
  return;
}

Assistant:

void CPU::ADC_ID_Y()
{
    cycles = 5;
    uint8_t acp = A, op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}